

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O0

void cscal(int n,complex<float> ca,complex<float> *cx,int incx)

{
  int iVar1;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  int local_28;
  int i;
  int incx_local;
  complex<float> *cx_local;
  int n_local;
  complex<float> ca_local;
  
  iVar1 = (int)cx;
  if ((0 < n) && (0 < iVar1)) {
    if (iVar1 == 1) {
      for (local_28 = 0; local_28 < n; local_28 = local_28 + 1) {
        std::operator*((complex<float> *)&stack0xfffffffffffffff0,
                       (complex<float> *)(ca._M_value + (long)local_28 * 8));
        *(undefined8 *)(ca._M_value + (long)local_28 * 8) = extraout_XMM0_Qa;
      }
    }
    else {
      for (local_28 = 0; local_28 < n; local_28 = local_28 + 1) {
        std::operator*((complex<float> *)&stack0xfffffffffffffff0,
                       (complex<float> *)(ca._M_value + (long)(local_28 * iVar1) * 8));
        *(undefined8 *)(ca._M_value + (long)(local_28 * iVar1) * 8) = extraout_XMM0_Qa_00;
      }
    }
  }
  return;
}

Assistant:

void cscal ( int n, complex <float> ca, complex <float> cx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    CSCAL scales a vector by a constant.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <float> CA, the multiplier.
//
//    Input/output, complex <float> CX[], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of CX.
//
{
  int i;

  if ( n <= 0 || incx <= 0 )
  {
    return;
  }

  if ( incx == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i] = ca * cx[i];
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i*incx] = ca * cx[i*incx];
    }
  }
  return;
}